

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

unsigned_long_long ZSTD_findDecompressedSize(void *src,size_t srcSize)

{
  U32 UVar1;
  uint uVar2;
  void *pvVar3;
  unsigned_long_long srcSize_00;
  void *in_RSI;
  size_t frameSrcSize;
  unsigned_long_long fcs;
  size_t skippableSize;
  U32 magicNumber;
  unsigned_long_long totalDstSize;
  void *in_stack_ffffffffffffffc0;
  void *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  void *src_00;
  unsigned_long_long local_8;
  
  local_8 = 0;
  while( true ) {
    while( true ) {
      src_00 = in_RSI;
      pvVar3 = (void *)ZSTD_startingInputLength
                                 ((ZSTD_format_e)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
      if (in_RSI < pvVar3) {
        if (src_00 != (void *)0x0) {
          local_8 = 0xfffffffffffffffe;
        }
        return local_8;
      }
      UVar1 = MEM_readLE32(in_RSI);
      if ((UVar1 & 0xfffffff0) != 0x184d2a50) break;
      in_stack_ffffffffffffffd0 =
           (void *)readSkippableFrameSize
                             ((void *)CONCAT44(UVar1,in_stack_ffffffffffffffd8),
                              (size_t)in_stack_ffffffffffffffd0);
      uVar2 = ZSTD_isError(0x2f3b55);
      if (uVar2 != 0) {
        return 0xfffffffffffffffe;
      }
      if (src_00 < in_stack_ffffffffffffffd0) {
        __assert_fail("skippableSize <= srcSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x9dd3,"unsigned long long ZSTD_findDecompressedSize(const void *, size_t)");
      }
      in_RSI = (void *)((long)src_00 - (long)in_stack_ffffffffffffffd0);
    }
    srcSize_00 = ZSTD_getFrameContentSize(src_00,local_8);
    if (0xfffffffffffffffd < srcSize_00) {
      return srcSize_00;
    }
    if (local_8 + srcSize_00 < local_8) {
      return 0xfffffffffffffffe;
    }
    local_8 = srcSize_00 + local_8;
    in_stack_ffffffffffffffc0 =
         (void *)ZSTD_findFrameCompressedSize(in_stack_ffffffffffffffd0,srcSize_00);
    uVar2 = ZSTD_isError(0x2f3c32);
    if (uVar2 != 0) {
      return 0xfffffffffffffffe;
    }
    if (src_00 < in_stack_ffffffffffffffc0) break;
    in_RSI = (void *)((long)src_00 - (long)in_stack_ffffffffffffffc0);
  }
  __assert_fail("frameSrcSize <= srcSize",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x9de4,"unsigned long long ZSTD_findDecompressedSize(const void *, size_t)");
}

Assistant:

unsigned long long ZSTD_findDecompressedSize(const void* src, size_t srcSize)
{
    unsigned long long totalDstSize = 0;

    while (srcSize >= ZSTD_startingInputLength(ZSTD_f_zstd1)) {
        U32 const magicNumber = MEM_readLE32(src);

        if ((magicNumber & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {
            size_t const skippableSize = readSkippableFrameSize(src, srcSize);
            if (ZSTD_isError(skippableSize)) return ZSTD_CONTENTSIZE_ERROR;
            assert(skippableSize <= srcSize);

            src = (const BYTE *)src + skippableSize;
            srcSize -= skippableSize;
            continue;
        }

        {   unsigned long long const fcs = ZSTD_getFrameContentSize(src, srcSize);
            if (fcs >= ZSTD_CONTENTSIZE_ERROR) return fcs;

            if (totalDstSize + fcs < totalDstSize)
                return ZSTD_CONTENTSIZE_ERROR; /* check for overflow */
            totalDstSize += fcs;
        }
        /* skip to next frame */
        {   size_t const frameSrcSize = ZSTD_findFrameCompressedSize(src, srcSize);
            if (ZSTD_isError(frameSrcSize)) return ZSTD_CONTENTSIZE_ERROR;
            assert(frameSrcSize <= srcSize);

            src = (const BYTE *)src + frameSrcSize;
            srcSize -= frameSrcSize;
        }
    }  /* while (srcSize >= ZSTD_frameHeaderSize_prefix) */

    if (srcSize) return ZSTD_CONTENTSIZE_ERROR;

    return totalDstSize;
}